

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall JetHead::Socket::write(Socket *this)

{
  int in_EDX;
  void *in_RSI;
  
  send(*(int *)&this->mListener,in_RSI,(long)in_EDX,0x4000);
  return;
}

Assistant:

int Socket::write( const void *buffer, int len )
{
	// Passing in the MSG_NOSIGNAL flag to tell the OS not to send us
	// SIGPIPE when the socket is closed during this call.  At some
	// point we might make this a member variable that can be tweaked
	// by the user, but that's interface clutter that we don't need
	// yet.
	return ::send(mFd, buffer, len, MSG_NOSIGNAL);
}